

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O1

int connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  rpchook_t *prVar6;
  pollfd pf;
  int err;
  socklen_t errlen;
  pollfd local_38;
  int local_30 [2];
  
  if (g_sys_connect_func == (connect_pfn_t)0x0) {
    g_sys_connect_func = (connect_pfn_t)dlsym(0xffffffffffffffff,"connect");
  }
  bVar1 = co_is_enable_sys_hook();
  iVar2 = (*g_sys_connect_func)(__fd,(sockaddr *)__addr,__len);
  if (bVar1) {
    if ((uint)__fd < 1000000) {
      prVar6 = g_rpchook_socket_fd[(uint)__fd];
    }
    else {
      prVar6 = (rpchook_t *)0x0;
    }
    if (prVar6 != (rpchook_t *)0x0) {
      if (__len < 0x11) {
        memcpy(&prVar6->dest,__addr,(ulong)__len);
      }
      if (((iVar2 < 0) && ((prVar6->user_flag & 0x800U) == 0)) &&
         (piVar4 = __errno_location(), *piVar4 == 0x73)) {
        iVar5 = 2;
        do {
          local_38.events = 0x1c;
          local_38.fd = __fd;
          local_38.revents = 0;
          iVar3 = poll(&local_38,1,25000);
          bVar1 = iVar5 != 0;
          iVar5 = iVar5 + -1;
          if (iVar3 == 1) break;
        } while (bVar1);
        if (((ulong)local_38 & 0x4000000000000) == 0) {
          *piVar4 = 0x6e;
        }
        else {
          local_30[0] = 0;
          local_30[1] = 4;
          iVar2 = getsockopt(__fd,1,4,local_30,(socklen_t *)(local_30 + 1));
          if (-1 < iVar2) {
            *piVar4 = local_30[0];
            iVar2 = -(uint)(local_30[0] != 0);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int connect(int fd, const struct sockaddr *address, socklen_t address_len)
{
	HOOK_SYS_FUNC( connect );

	if( !co_is_enable_sys_hook() )
	{
		return g_sys_connect_func(fd,address,address_len);
	}

	//1.sys call
	int ret = g_sys_connect_func( fd,address,address_len );

	rpchook_t *lp = get_by_fd( fd );
	if( !lp ) return ret;

	if( sizeof(lp->dest) >= address_len )
	{
		 memcpy( &(lp->dest),address,(int)address_len );
	}
	if( O_NONBLOCK & lp->user_flag ) 
	{
		return ret;
	}
	
	if (!(ret < 0 && errno == EINPROGRESS))
	{
		return ret;
	}

	//2.wait
	int pollret = 0;
	struct pollfd pf = { 0 };

	for(int i=0;i<3;i++) //25s * 3 = 75s
	{
		memset( &pf,0,sizeof(pf) );
		pf.fd = fd;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );

		pollret = poll( &pf,1,25000 );

		if( 1 == pollret  )
		{
			break;
		}
	}

	if( pf.revents & POLLOUT ) //connect succ
	{
    // 3.check getsockopt ret
    int err = 0;
    socklen_t errlen = sizeof(err);
    ret = getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen);
    if (ret < 0) {
      return ret;
    } else if (err != 0) {
      errno = err;
      return -1;
    }
    errno = 0;
    return 0;
  }

  errno = ETIMEDOUT;
	return ret;
}